

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageLevel.cpp
# Opt level: O3

void __thiscall
Imf_3_2::DeepImageLevel::moveSampleList
          (DeepImageLevel *this,size_t i,uint oldNumSamples,uint newNumSamples,
          size_t newSampleListPosition)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->_channels)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    (**(code **)(**(long **)(p_Var1 + 2) + 0x30))
              (*(long **)(p_Var1 + 2),i,oldNumSamples,newNumSamples,newSampleListPosition);
  }
  return;
}

Assistant:

void
DeepImageLevel::moveSampleList (
    size_t       i,
    unsigned int oldNumSamples,
    unsigned int newNumSamples,
    size_t       newSampleListPosition)
{
    for (ChannelMap::iterator j = _channels.begin (); j != _channels.end ();
         ++j)
    {
        j->second->moveSampleList (
            i, oldNumSamples, newNumSamples, newSampleListPosition);
    }
}